

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall UnitTestBasehello11::~UnitTestBasehello11(UnitTestBasehello11 *this)

{
  UnitTestBase::~UnitTestBase(&this->super_UnitTestBase);
  operator_delete(this);
  return;
}

Assistant:

TEST_CASE(hello11)
{
    Regex t("[^abc]*");
    EXPECT_TRUE(t.Match("xyz"));
    EXPECT_FALSE(t.Match("a"));
    EXPECT_FALSE(t.Match("b"));
    EXPECT_FALSE(t.Match("abc"));
    EXPECT_FALSE(t.Match("fuckabc"));
}